

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O2

MPP_RET mpp_buf_slot_dequeue(MppBufSlots slots,RK_S32 *index,SlotQueueType type)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  MPP_RET MVar4;
  AutoMutex auto_lock;
  
  if (slots == (MppBufSlots)0x0 || index == (RK_S32 *)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_dequeue");
    MVar4 = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock = *slots;
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    plVar3 = (long *)((long)slots + (ulong)type * 0x10 + 0xa0);
    plVar1 = (long *)*plVar3;
    MVar4 = MPP_NOK;
    if ((plVar1 != plVar3) && ((*(byte *)(plVar1 + 2) & 2) == 0)) {
      lVar2 = *plVar1;
      plVar3 = (long *)plVar1[1];
      *(long **)(lVar2 + 8) = plVar3;
      *plVar3 = lVar2;
      *plVar1 = (long)plVar1;
      plVar1[1] = (long)plVar1;
      if (*(int *)((long)slots + 0x60) <= *(int *)((long)plVar1 + 0x14)) {
        _dump_slots("mpp_buf_slot_dequeue",(MppBufSlotsImpl *)slots);
        _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "slot->index < impl->buf_count","mpp_buf_slot_dequeue",0x459);
        abort();
      }
      MVar4 = MPP_OK;
      slot_ops_with_log((MppBufSlotsImpl *)slots,(MppBufSlotEntry *)(plVar1 + -1),type + 0x13,
                        (void *)0x0);
      *(int *)((long)slots + 0x10) = *(int *)((long)slots + 0x10) + 1;
      *index = *(RK_S32 *)((long)plVar1 + 0x14);
    }
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_buf_slot_dequeue(MppBufSlots slots, RK_S32 *index, SlotQueueType type)
{
    if (NULL == slots || NULL == index) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    AutoMutex auto_lock(impl->lock);
    if (list_empty(&impl->queue[type]))
        return MPP_NOK;

    MppBufSlotEntry *slot = list_entry(impl->queue[type].next, MppBufSlotEntry, list);
    if (slot->status.not_ready)
        return MPP_NOK;

    // make sure that this slot is just the next display slot
    list_del_init(&slot->list);
    slot_assert(impl, slot->index < impl->buf_count);
    slot_ops_with_log(impl, slot, (MppBufSlotOps)(SLOT_DEQUEUE + type), NULL);
    impl->display_count++;
    *index = slot->index;

    return MPP_OK;
}